

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::processSources(MakefileGenerator *this)

{
  QMakeProject *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->project;
  QString::QString((QString *)&local_40,"compile_included_sources");
  bVar1 = QMakeProject::isActiveConfig(this_00,(QString *)&local_40,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (!bVar1) {
    filterIncludedFiles(this,"SOURCES");
    filterIncludedFiles(this,"GENERATED_SOURCES");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakefileGenerator::processSources()
{
    if (project->isActiveConfig("compile_included_sources"))
        return;

    filterIncludedFiles("SOURCES");
    filterIncludedFiles("GENERATED_SOURCES");
}